

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Roller.cxx
# Opt level: O0

int __thiscall Fl_Roller::handle(Fl_Roller *this,int event)

{
  int iVar1;
  double dVar2;
  int local_2c;
  int newpos;
  int event_local;
  Fl_Roller *this_local;
  
  iVar1 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
  if (iVar1 == 0) {
    local_2c = Fl::event_y();
  }
  else {
    local_2c = Fl::event_x();
  }
  switch(event) {
  case 1:
    iVar1 = Fl::visible_focus();
    if (iVar1 != 0) {
      Fl::focus((Fl_Widget *)this);
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    Fl_Valuator::handle_push(&this->super_Fl_Valuator);
    handle::ipos = local_2c;
    this_local._4_4_ = 1;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 4:
    this_local._4_4_ = 1;
    break;
  case 5:
    dVar2 = Fl_Valuator::previous_value(&this->super_Fl_Valuator);
    dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,local_2c - handle::ipos);
    dVar2 = Fl_Valuator::round(&this->super_Fl_Valuator,dVar2);
    dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
    this_local._4_4_ = 1;
    break;
  case 6:
  case 7:
    iVar1 = Fl::visible_focus();
    if (iVar1 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      Fl_Widget::redraw((Fl_Widget *)this);
      this_local._4_4_ = 1;
    }
    break;
  case 8:
    iVar1 = Fl::event_key();
    switch(iVar1) {
    case 0xff51:
      iVar1 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar1 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,-1);
        dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
        this_local._4_4_ = 1;
      }
      break;
    case 0xff52:
      iVar1 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar1 == 0) {
        dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,-1);
        dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    case 0xff53:
      iVar1 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar1 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,1);
        dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
        this_local._4_4_ = 1;
      }
      break;
    case 0xff54:
      iVar1 = Fl_Valuator::horizontal(&this->super_Fl_Valuator);
      if (iVar1 == 0) {
        dVar2 = Fl_Valuator::value(&this->super_Fl_Valuator);
        dVar2 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar2,1);
        dVar2 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar2);
        Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar2);
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 0;
      }
      break;
    default:
      this_local._4_4_ = 0;
    }
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Roller::handle(int event) {
  static int ipos;
  int newpos = horizontal() ? Fl::event_x() : Fl::event_y();
  switch (event) {
  case FL_PUSH:
    if (Fl::visible_focus()) {
      Fl::focus(this);
      redraw();
    }
    handle_push();
    ipos = newpos;
    return 1;
  case FL_DRAG:
    handle_drag(clamp(round(increment(previous_value(),newpos-ipos))));
    return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD :
    switch (Fl::event_key()) {
      case FL_Up:
        if (horizontal()) return 0;
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Down:
        if (horizontal()) return 0;
	handle_drag(clamp(increment(value(),1)));
	return 1;
      case FL_Left:
        if (!horizontal()) return 0;
	handle_drag(clamp(increment(value(),-1)));
	return 1;
      case FL_Right:
        if (!horizontal()) return 0;
	handle_drag(clamp(increment(value(),1)));
	return 1;
      default:
        return 0;
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}